

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::MarkInputsDirty(CWallet *this,CTransactionRef *tx)

{
  long lVar1;
  bool bVar2;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range1;
  iterator it;
  const_iterator __end1;
  const_iterator __begin1;
  CWalletTx *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffffa8);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::begin((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RDI)
  ;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::end((vector<CTxIn,_std::allocator<CTxIn>_> *)in_RDI);
  while (bVar2 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                           ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_stack_ffffffffffffffb8,
                            (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             *)in_RDI), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb8 =
         __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
         operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                   in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 =
         (CWalletTx *)
         &(((_Vector_impl *)
           &in_RDI[8]._M_h.
            super__Hashtable_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           )->super__Vector_impl_data)._M_finish;
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffffa8);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::find(in_RDI,(key_type *)in_stack_ffffffffffffffa8);
    std::
    unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
    ::end(in_RDI);
    bVar2 = std::__detail::operator==
                      ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_stack_ffffffffffffffb8,
                       (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> *)
                       in_RDI);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      std::__detail::_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
      operator->((_Node_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
                 in_stack_ffffffffffffffa8);
      CWalletTx::MarkDirty(in_stack_ffffffffffffffa8);
    }
    __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
    operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
               in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::MarkInputsDirty(const CTransactionRef& tx)
{
    for (const CTxIn& txin : tx->vin) {
        auto it = mapWallet.find(txin.prevout.hash);
        if (it != mapWallet.end()) {
            it->second.MarkDirty();
        }
    }
}